

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InternalException::InternalException<int,unsigned_char,unsigned_char>
          (InternalException *this,string *msg,int params,uchar params_1,uchar params_2)

{
  undefined3 in_register_00000009;
  undefined4 in_register_00000014;
  uchar in_R9B;
  string local_30;
  
  Exception::ConstructMessage<int,unsigned_char,unsigned_char>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             CONCAT31(in_register_00000009,params_1),params_2,in_R9B);
  duckdb::InternalException::InternalException(this,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}